

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void arb1_log(Context *ctx,char *opcode)

{
  char local_d8 [8];
  char buf [64];
  char src0 [64];
  char dst [64];
  char *opcode_local;
  Context *ctx_local;
  
  if ((ctx->source_args[0].src_mod == SRCMOD_NONE) ||
     (ctx->source_args[0].src_mod == SRCMOD_ABSNEGATE)) {
    ctx->source_args[0].src_mod = SRCMOD_ABS;
  }
  make_ARB1_destarg_string(ctx,src0 + 0x38,0x40);
  make_ARB1_srcarg_string(ctx,0,buf + 0x38,0x40);
  if (ctx->source_args[0].src_mod == SRCMOD_ABS) {
    output_line(ctx,"%s%s, %s;",opcode,src0 + 0x38,buf + 0x38);
  }
  else {
    allocate_ARB1_scratch_reg_name(ctx,local_d8,0x40);
    output_line(ctx,"ABS %s, %s;",local_d8,buf + 0x38);
    output_line(ctx,"%s%s, %s.x;",opcode,src0 + 0x38,local_d8);
  }
  emit_ARB1_dest_modifiers(ctx);
  return;
}

Assistant:

static void arb1_log(Context *ctx, const char *opcode)
{
    // !!! FIXME: SRCMOD_NEGATE can be made into SRCMOD_ABS here, too
    // we can optimize this to use nv2's |abs| construct in some cases.
    if ( (ctx->source_args[0].src_mod == SRCMOD_NONE) ||
         (ctx->source_args[0].src_mod == SRCMOD_ABSNEGATE) )
        ctx->source_args[0].src_mod = SRCMOD_ABS;

    char dst[64]; make_ARB1_destarg_string(ctx, dst, sizeof (dst));
    char src0[64]; make_ARB1_srcarg_string(ctx, 0, src0, sizeof (src0));

    if (ctx->source_args[0].src_mod == SRCMOD_ABS)
        output_line(ctx, "%s%s, %s;", opcode, dst, src0);
    else
    {
        char buf[64]; allocate_ARB1_scratch_reg_name(ctx, buf, sizeof (buf));
        output_line(ctx, "ABS %s, %s;", buf, src0);
        output_line(ctx, "%s%s, %s.x;", opcode, dst, buf);
    } // else

    emit_ARB1_dest_modifiers(ctx);
}